

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
pod_vector<unsafe_pod_vector<IsoSpec::ProbAndConfPtr>_>::pod_vector
          (pod_vector<unsafe_pod_vector<IsoSpec::ProbAndConfPtr>_> *this,size_t initial_size)

{
  void *pvVar1;
  bad_alloc *this_00;
  long in_RSI;
  long *in_RDI;
  
  pvVar1 = malloc(in_RSI * 0x18);
  in_RDI[2] = (long)pvVar1;
  if (in_RDI[2] == 0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  in_RDI[1] = in_RDI[2];
  *in_RDI = in_RDI[2] + in_RSI * 0x18;
  return;
}

Assistant:

explicit pod_vector(size_t initial_size = 16)
    {
    #if !ISOSPEC_BUILDING_R
        static_assert(std::is_trivially_copyable<T>::value, "Cannot use a pod_vector with a non-Plain Old Data type.");
    #endif

        store = reinterpret_cast<T*>(malloc(sizeof(T) * initial_size));
        if(store == NULL)
            throw std::bad_alloc();
        first_free = store;
        backend_past_end = store + initial_size;
    }